

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

bool __thiscall
Js::DictionaryTypeHandlerBase<int>::IsObjTypeSpecEquivalentImpl<true>
          (DictionaryTypeHandlerBase<int> *this,Type *type,EquivalentPropertyEntry *entry)

{
  ushort uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ScriptContext *this_00;
  undefined4 *puVar5;
  ushort uVar6;
  ushort uVar7;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<int> *pDStack_30;
  int i;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  this_00 = Js::Type::GetScriptContext(type);
  local_40 = ScriptContext::GetPropertyNameLocked(this_00,entry->propertyId);
  bVar3 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_40,&stack0xffffffffffffffd0,
                     (int *)((long)&propertyRecord + 4));
  if ((!bVar3) || ((pDStack_30->Attributes & 8) != 0)) goto LAB_00da486a;
  if ((pDStack_30->flags & IsAccessor) == None) {
    iVar4 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDStack_30);
    if (iVar4 < 0xffff) {
      uVar7 = (ushort)iVar4;
      if (uVar7 == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypeHandler.h"
                                    ,0xaf,"(slotIndex != Constants::NoSlot)",
                                    "slotIndex != Constants::NoSlot");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      uVar1 = (this->super_DynamicTypeHandler).inlineSlotCapacity;
      uVar6 = -uVar1;
      if (uVar7 < uVar1) {
        uVar6 = (this->super_DynamicTypeHandler).offsetOfInlineSlots >> 3;
      }
      if ((ushort)(uVar6 + uVar7) == 0xffff) goto LAB_00da486a;
      if ((((ushort)(uVar6 + uVar7) != entry->slotIndex) ||
          (entry->isAuxSlot != (int)(uint)uVar1 <= iVar4)) ||
         ((entry->mustBeWritable == true &&
          (((pDStack_30->Attributes & 4) == 0 ||
           ((pDStack_30->flags & (IsFixed|IsInitialized)) != IsInitialized)))))) goto LAB_00da4877;
    }
    else {
LAB_00da486a:
      if ((entry->slotIndex != 0xffff) || (entry->mustBeWritable != false)) goto LAB_00da4877;
    }
    bVar3 = true;
  }
  else {
LAB_00da4877:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool DictionaryTypeHandlerBase<T>::IsObjTypeSpecEquivalentImpl(const Type* type, const EquivalentPropertyEntry *entry)
    {
        ScriptContext* scriptContext = type->GetScriptContext();

        T absSlotIndex = Constants::NoSlot;
        PropertyIndex relSlotIndex = Constants::NoSlot;

        const PropertyRecord* propertyRecord =
            doLock ? scriptContext->GetPropertyNameLocked(entry->propertyId) : scriptContext->GetPropertyName(entry->propertyId);
        DictionaryPropertyDescriptor<T>* descriptor;
        if (this->propertyMap->TryGetReference(propertyRecord, &descriptor) && !(descriptor->Attributes & PropertyDeleted))
        {
            // We don't object type specialize accessors at this point, so if we see an accessor on an object we must have a mismatch.
            // When we add support for accessors we will need another bit on EquivalentPropertyEntry indicating whether we expect
            // a data or accessor property.
            if (descriptor->GetIsAccessor())
            {
                return false;
            }

            absSlotIndex = descriptor->template GetDataPropertyIndex<false>();
            if (absSlotIndex <= Constants::PropertyIndexMax)
            {
                relSlotIndex = AdjustValidSlotIndexForInlineSlots(static_cast<PropertyIndex>(absSlotIndex));
            }
        }

        if (relSlotIndex != Constants::NoSlot)
        {
            if (relSlotIndex != entry->slotIndex || ((absSlotIndex >= GetInlineSlotCapacity()) != entry->isAuxSlot))
            {
                return false;
            }

            if (entry->mustBeWritable && (!(descriptor->Attributes & PropertyWritable) || descriptor->IsOrMayBecomeFixed()))
            {
                return false;
            }
        }
        else
        {
            if (entry->slotIndex != Constants::NoSlot || entry->mustBeWritable)
            {
                return false;
            }
        }

        return true;
    }